

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_table.cpp
# Opt level: O1

void __thiscall
duckdb::DataTable::RemoveFromIndexes
          (DataTable *this,TableAppendState *state,DataChunk *chunk,Vector *row_identifiers)

{
  pointer puVar1;
  int iVar2;
  DataTableInfo *pDVar3;
  BoundIndex *this_00;
  InternalException *this_01;
  pointer this_02;
  string local_50;
  
  pDVar3 = shared_ptr<duckdb::DataTableInfo,_true>::operator->(&this->info);
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&pDVar3->indexes);
  if (iVar2 != 0) {
    ::std::__throw_system_error(iVar2);
  }
  this_02 = (pDVar3->indexes).indexes.
            super_vector<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (pDVar3->indexes).indexes.
           super_vector<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (this_02 == puVar1) {
      pthread_mutex_unlock((pthread_mutex_t *)&pDVar3->indexes);
      return;
    }
    this_00 = (BoundIndex *)
              unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>::operator*
                        (this_02);
    iVar2 = (*(this_00->super_Index)._vptr_Index[2])(this_00);
    if ((char)iVar2 == '\0') break;
    BoundIndex::Delete(this_00,chunk,row_identifiers);
    this_02 = this_02 + 1;
  }
  this_01 = (InternalException *)__cxa_allocate_exception(0x10);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"Unbound index found in DataTable::RemoveFromIndexes","");
  InternalException::InternalException(this_01,&local_50);
  __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void DataTable::RemoveFromIndexes(TableAppendState &state, DataChunk &chunk, Vector &row_identifiers) {
	D_ASSERT(IsMainTable());
	info->indexes.Scan([&](Index &index) {
		if (!index.IsBound()) {
			throw InternalException("Unbound index found in DataTable::RemoveFromIndexes");
		}
		auto &bound_index = index.Cast<BoundIndex>();
		bound_index.Delete(chunk, row_identifiers);
		return false;
	});
}